

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sound.cpp
# Opt level: O0

int __thiscall CSound::Update(CSound *this)

{
  int iVar1;
  long in_RDI;
  int WantedVolume;
  undefined4 local_c;
  
  local_c = *(int *)(*(long *)(in_RDI + 0x18) + 0xe8c);
  iVar1 = (**(code **)(**(long **)(in_RDI + 0x20) + 0x1a0))();
  if ((iVar1 == 0) && (*(int *)(*(long *)(in_RDI + 0x18) + 0xe90) != 0)) {
    local_c = 0;
  }
  if (local_c != m_SoundVolume) {
    lock_wait((LOCK)0x13e107);
    m_SoundVolume = local_c;
    lock_unlock((LOCK)0x13e11d);
  }
  return 0;
}

Assistant:

int CSound::Update()
{
	// update volume
	int WantedVolume = m_pConfig->m_SndVolume;

	if(!m_pGraphics->WindowActive() && m_pConfig->m_SndNonactiveMute)
		WantedVolume = 0;

	if(WantedVolume != m_SoundVolume)
	{
		lock_wait(m_SoundLock);
		m_SoundVolume = WantedVolume;
		lock_unlock(m_SoundLock);
	}

	return 0;
}